

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

Var __thiscall Gluco::Solver::newVar(Solver *this,bool sign,bool dvar)

{
  CRef CVar1;
  int v;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  double dVar2;
  VarData VVar3;
  VarData local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,dvar);
  local_38 = (undefined4)CONCAT71(in_register_00000031,sign);
  v = (this->vardata).sz;
  local_40.reason = v * 2;
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::init
            (&this->watches,(EVP_PKEY_CTX *)&local_40);
  CVar1 = v * 2 + 1;
  local_40.reason = CVar1;
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::init
            (&this->watches,(EVP_PKEY_CTX *)&local_40);
  local_40.reason = v * 2;
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::init
            (&this->watchesBin,(EVP_PKEY_CTX *)&local_40);
  local_40.reason = CVar1;
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::init
            (&this->watchesBin,(EVP_PKEY_CTX *)&local_40);
  local_40.reason._0_1_ = 2;
  vec<Gluco::lbool>::push(&this->assigns,(lbool *)&local_40);
  local_40.reason = 0xffffffff;
  local_40.level = 0;
  vec<Gluco::Solver::VarData>::push(&this->vardata,&local_40);
  VVar3.reason = 0;
  VVar3.level = 0;
  if (this->rnd_init_act == true) {
    dVar2 = drand(&this->random_seed);
    VVar3 = (VarData)(dVar2 * 1e-05);
  }
  local_40 = VVar3;
  vec<double>::push(&this->activity,(double *)&local_40);
  local_40 = (VarData)((ulong)local_40 & 0xffffffffffffff00);
  vec<char>::push(&this->seen,(char *)&local_40);
  local_40 = (VarData)((ulong)local_40 & 0xffffffff00000000);
  vec<unsigned_int>::push(&this->permDiff,&local_40.reason);
  local_40.reason._0_1_ = (char)local_38;
  vec<char>::push(&this->polarity,(char *)&local_40);
  vec<char>::push(&this->decision);
  vec<Gluco::Lit>::capacity(&this->trail,v + 1);
  setDecisionVar(this,v,local_34._0_1_);
  return v;
}

Assistant:

Var Solver::newVar(bool sign, bool dvar)
{
    int v = nVars();
    watches  .init(mkLit(v, false));
    watches  .init(mkLit(v, true ));
    watchesBin  .init(mkLit(v, false));
    watchesBin  .init(mkLit(v, true ));
    assigns  .push(l_Undef);
    vardata  .push(mkVarData(CRef_Undef, 0));
    //activity .push(0);
    activity .push(rnd_init_act ? drand(random_seed) * 0.00001 : 0);
    seen     .push(0);
    permDiff .push(0);
    polarity .push(sign);
    decision .push();
    trail    .capacity(v+1);
    setDecisionVar(v, dvar);
    return v;
}